

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlGlyphDefn.h
# Opt level: O2

void __thiscall GdlGlyphDefn::GdlGlyphDefn(GdlGlyphDefn *this,GlyphType glft,int nFirst,int nLast)

{
  GdlGlyphClassMember::GdlGlyphClassMember(&this->super_GdlGlyphClassMember);
  (this->super_GdlGlyphClassMember).super_GdlDefn._vptr_GdlDefn =
       (_func_int **)&PTR__GdlGlyphDefn_00211b30;
  *(GlyphType *)&(this->super_GdlGlyphClassMember).field_0x34 = glft;
  this->m_nFirst = nFirst;
  this->m_nLast = nLast;
  this->m_wCodePage = 0;
  this->m_nUnicodeInput = 0;
  this->m_pglfOutput = (GdlGlyphDefn *)0x0;
  (this->m_sta)._M_dataplus._M_p = (pointer)&(this->m_sta).field_2;
  (this->m_sta)._M_string_length = 0;
  (this->m_sta).field_2._M_local_buf[0] = '\0';
  (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vwGlyphIDs).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>.
           _M_impl.super__Vector_impl_data._M_finish + 2) = 0;
  *(undefined8 *)
   ((long)&(this->m_vgbdy).super__Vector_base<GlyphBoundaries,_std::allocator<GlyphBoundaries>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage + 2) = 0;
  if (glft == kglftCodepoint) {
    this->m_wCodePage = (utf16)nLast;
    this->m_nLast = nFirst;
  }
  return;
}

Assistant:

GdlGlyphDefn(GlyphType glft, int nFirst, int nLast)
		:	GdlGlyphClassMember(),
			m_glft(glft),
			m_nFirst(nFirst),
			m_nLast(nLast),
			m_wCodePage(0),
			m_nUnicodeInput(0),
			m_pglfOutput(NULL),
			m_fGAResolved(false),
			m_fNoRangeCheck(false)
	{
		Assert(m_glft != kglftPseudo);

		if (m_glft == kglftCodepoint)
		{
			m_wCodePage = (utf16)m_nLast;
			m_nLast = m_nFirst;
		}
	}